

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Path * __thiscall kj::PathPtr::append(Path *__return_storage_ptr__,PathPtr *this,Path *suffix)

{
  size_t sVar1;
  String *pSVar2;
  char *pcVar3;
  String *p;
  String *pSVar4;
  String *pSVar5;
  char *size;
  long lVar6;
  char *value;
  Array<kj::String> *__range1;
  ArrayBuilder<kj::String> newParts;
  String *pSStack_60;
  String local_48;
  
  pSVar4 = (String *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,(suffix->parts).size_ + (this->parts).size_,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr *)0x0);
  sVar1 = (this->parts).size_;
  pSStack_60 = pSVar4;
  if (sVar1 != 0) {
    pSVar2 = (this->parts).ptr;
    lVar6 = 0;
    do {
      pcVar3 = *(char **)((long)&(pSVar2->content).size_ + lVar6);
      value = pcVar3;
      if (pcVar3 != (char *)0x0) {
        value = *(char **)((long)&(pSVar2->content).ptr + lVar6);
      }
      size = (char *)0x0;
      if (pcVar3 != (char *)0x0) {
        size = pcVar3 + -1;
      }
      heapString(&local_48,value,(size_t)size);
      (pSStack_60->content).ptr = local_48.content.ptr;
      (pSStack_60->content).size_ = local_48.content.size_;
      (pSStack_60->content).disposer = local_48.content.disposer;
      pSStack_60 = pSStack_60 + 1;
      lVar6 = lVar6 + 0x18;
    } while (sVar1 * 0x18 != lVar6);
  }
  sVar1 = (suffix->parts).size_;
  if (sVar1 != 0) {
    pSVar5 = (suffix->parts).ptr;
    pSVar2 = pSVar5 + sVar1;
    do {
      (pSStack_60->content).ptr = (pSVar5->content).ptr;
      (pSStack_60->content).size_ = (pSVar5->content).size_;
      (pSStack_60->content).disposer = (pSVar5->content).disposer;
      (pSVar5->content).ptr = (char *)0x0;
      (pSVar5->content).size_ = 0;
      pSStack_60 = pSStack_60 + 1;
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar2);
  }
  (__return_storage_ptr__->parts).ptr = pSVar4;
  (__return_storage_ptr__->parts).size_ =
       ((long)pSStack_60 - (long)pSVar4 >> 3) * -0x5555555555555555;
  (__return_storage_ptr__->parts).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

Path PathPtr::append(Path&& suffix) const {
  auto newParts = kj::heapArrayBuilder<String>(parts.size() + suffix.parts.size());
  for (auto& p: parts) newParts.add(heapString(p));
  for (auto& p: suffix.parts) newParts.add(kj::mv(p));
  return Path(newParts.finish(), Path::ALREADY_CHECKED);
}